

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemFromBtree(BtCursor *pCur,u32 offset,u32 amt,Mem *pMem)

{
  int local_30;
  u32 local_2c;
  int rc;
  u32 available;
  char *zData;
  Mem *pMem_local;
  u32 amt_local;
  u32 offset_local;
  BtCursor *pCur_local;
  
  local_2c = 0;
  local_30 = 0;
  zData = (char *)pMem;
  pMem_local._0_4_ = amt;
  pMem_local._4_4_ = offset;
  _amt_local = pCur;
  _rc = sqlite3BtreePayloadFetch(pCur,&local_2c);
  if (local_2c < pMem_local._4_4_ + (u32)pMem_local) {
    local_30 = vdbeMemFromBtreeResize(_amt_local,pMem_local._4_4_,(u32)pMem_local,(Mem *)zData);
  }
  else {
    *(ulong *)(zData + 0x10) = (long)_rc + (ulong)pMem_local._4_4_;
    zData[8] = '\x10';
    zData[9] = '\x10';
    *(u32 *)(zData + 0xc) = (u32)pMem_local;
  }
  return local_30;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtree(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 offset,       /* Offset from the start of data to return bytes from. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  char *zData;        /* Data from the btree layer */
  u32 available = 0;  /* Number of bytes available on the local btree page */
  int rc = SQLITE_OK; /* Return code */

  assert( sqlite3BtreeCursorIsValid(pCur) );
  assert( !VdbeMemDynamic(pMem) );

  /* Note: the calls to BtreeKeyFetch() and DataFetch() below assert() 
  ** that both the BtShared and database handle mutexes are held. */
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  zData = (char *)sqlite3BtreePayloadFetch(pCur, &available);
  assert( zData!=0 );

  if( offset+amt<=available ){
    pMem->z = &zData[offset];
    pMem->flags = MEM_Blob|MEM_Ephem;
    pMem->n = (int)amt;
  }else{
    rc = vdbeMemFromBtreeResize(pCur, offset, amt, pMem);
  }

  return rc;
}